

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perf_test.cpp
# Opt level: O1

void atomic_inc_acq_rel(size_t COUNT)

{
  long lVar1;
  size_t sVar2;
  ostream *poVar3;
  long lVar4;
  double dVar5;
  double dVar6;
  uint64_t c;
  
  lVar4 = 0x10000000;
  lVar1 = std::chrono::_V2::system_clock::now();
  do {
    LOCK();
    UNLOCK();
    lVar4 = lVar4 + -1;
  } while (lVar4 != 0);
  lVar4 = std::chrono::_V2::system_clock::now();
  dVar5 = (double)(lVar4 - lVar1) / 1000000000.0;
  dVar6 = dVar5 * 1000.0 * 1000.0 * 1000.0 * 3.725290298461914e-09;
  expand_name("atomic_inc_acq_rel");
  sVar2 = strlen(expand_name::buf);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,expand_name::buf,sVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,": ",2);
  poVar3 = std::ostream::_M_insert<double>(dVar6);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"ns per operation,\t",0x12);
  poVar3 = std::ostream::_M_insert<double>(dVar6 / unit);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ticks,\t",8);
  poVar3 = std::ostream::_M_insert<double>(((268435456.0 / dVar5) / 1000.0) / 1000.0);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," Mrps",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
  std::ostream::put((char)poVar3);
  std::ostream::flush();
  return;
}

Assistant:

static void __attribute__((noinline))
atomic_inc_acq_rel(const size_t COUNT = 0x10000000)
{
    uint64_t c;
    now_t start = now();
    for (size_t i = 0; i < COUNT; i++)
    {
        __atomic_add_fetch(&c, 1, __ATOMIC_ACQ_REL);
    }
    now_t stop = now();

    std::chrono::duration<double> diff = stop - start;
    double ns_per_op = diff.count() * 1000 * 1000 * 1000 / COUNT;
    double Mrps = COUNT / diff.count() / 1000 / 1000;
    std::cout << NAME << ": " << ns_per_op << "ns per operation,\t"
              << (ns_per_op / unit) << " ticks,\t"
              << Mrps << " Mrps" << std::endl;
}